

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O2

Identifier * __thiscall psy::C::SemanticModel::freshSyntheticTag(SemanticModel *this)

{
  _Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false> _Var1;
  pointer ppVar2;
  Identifier *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tag;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
  p;
  
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
       .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>._M_head_impl;
  std::__cxx11::to_string
            (&p.first,((long)*(pointer *)((long)&(_Var1._M_head_impl)->syntheticTags_ + 8) -
                      *(long *)&((_Var1._M_head_impl)->syntheticTags_).
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>_>_>
                      ) / 0x28);
  std::operator+(&tag,&SemanticModelImpl::syntheticTagPrefix__abi_cxx11_,&p.first);
  std::__cxx11::string::~string((string *)&p);
  p.first._M_string_length = tag._M_string_length;
  p.first._M_dataplus._M_p = (pointer)&p.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tag._M_dataplus._M_p == &tag.field_2) {
    p.first.field_2._8_8_ = tag.field_2._8_8_;
  }
  else {
    p.first._M_dataplus = tag._M_dataplus;
  }
  tag._M_string_length = 0;
  p.second = (Identifier *)0x0;
  tag.field_2._M_local_buf[0] = '\0';
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  std::
  vector<std::pair<std::__cxx11::string,psy::C::Identifier*>,std::allocator<std::pair<std::__cxx11::string,psy::C::Identifier*>>>
  ::emplace_back<std::pair<std::__cxx11::string,psy::C::Identifier*>>
            ((vector<std::pair<std::__cxx11::string,psy::C::Identifier*>,std::allocator<std::pair<std::__cxx11::string,psy::C::Identifier*>>>
              *)&((this->impl_)._M_t.
                  super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                  .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                 _M_head_impl)->syntheticTags_,&p);
  this_00 = (Identifier *)operator_new(0x30);
  ppVar2 = *(pointer *)
            ((long)&((this->impl_)._M_t.
                     super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                    _M_head_impl)->syntheticTags_ + 8);
  Identifier::Identifier
            (this_00,*(char **)&ppVar2[0xffffffffffffffff].first,
             *(uint *)((long)(ppVar2 + 0xffffffffffffffff) + 8));
  *(Identifier **)
   ((long)(*(pointer *)
            ((long)&((this->impl_)._M_t.
                     super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                    _M_head_impl)->syntheticTags_ + 8) + 0xffffffffffffffff) + 0x20) = this_00;
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::~string((string *)&tag);
  return this_00;
}

Assistant:

const Identifier* SemanticModel::freshSyntheticTag()
{
    auto tag = P->syntheticTagPrefix_ + std::to_string(P->syntheticTags_.size());
    std::pair<std::string, Identifier*> p(std::move(tag), nullptr);
    P->syntheticTags_.emplace_back(std::move(p));
    auto ident = new Identifier(
                P->syntheticTags_.back().first.c_str(),
                P->syntheticTags_.back().first.length());
    P->syntheticTags_.back().second = ident;
    return ident;
}